

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  short sVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  bool bVar5;
  ImVec2 frame_padding;
  ImGuiContext *pIVar6;
  ImU32 IVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  uint in_ECX;
  byte *in_RDX;
  ImRect *in_RSI;
  ImGuiTabBar *in_RDI;
  bool bVar11;
  bool bVar12;
  float _x;
  ImVec2 IVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  ImGuiTabBar *in_stack_00000010;
  bool text_clipped;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_cursor_max_pos;
  bool want_clip_rect;
  ImRect bb;
  ImVec2 pos;
  bool is_central_section;
  ImVec2 backup_main_cursor_pos;
  bool tab_contents_visible;
  bool is_tab_button;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  bool tab_is_new;
  ImGuiTabItem *tab;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  ImGuiHoveredFlags flags_00;
  ImGuiTabItem *in_stack_fffffffffffffe50;
  ImGuiID IVar16;
  ImGuiTabBar *in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe60;
  ImGuiCol in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined2 in_stack_fffffffffffffe74;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 intersect_with_current_clip_rect;
  ImRect *in_stack_fffffffffffffe78;
  ImVec2 *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  ImGuiButtonFlags flags_01;
  ImVec2 *in_stack_fffffffffffffe90;
  ImRect *out_hovered;
  ImRect *bb_00;
  byte local_13e;
  byte local_13d;
  ImGuiID local_13c;
  undefined1 local_135;
  ImU32 local_134;
  ImDrawList *local_130;
  byte local_127;
  byte local_126;
  byte local_125;
  uint local_124;
  ImVec2 local_120;
  ImVec2 local_118;
  ImU32 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  byte is_contents_visible;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float local_e8;
  float in_stack_ffffffffffffff1c;
  ImDrawList *in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  ImVec2 local_c4;
  float local_bc;
  float in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint uVar17;
  ImGuiTabItem *local_68;
  float local_5c;
  uint local_24;
  byte *local_20;
  bool local_1;
  
  flags_01 = (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  if ((in_RDI->WantLayout & 1U) != 0) {
    TabBarLayout(in_stack_00000010);
  }
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if ((pIVar3->SkipItems & 1U) == 0) {
    IVar7 = TabBarCalcTabID(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    if ((in_RDX == (byte *)0x0) || ((*in_RDX & 1) != 0)) {
      local_24 = in_ECX;
      if ((in_ECX & 0x100000) == 0) {
        local_20 = in_RDX;
        if (in_RDX == (byte *)0x0) {
          local_24 = in_ECX | 0x100000;
        }
      }
      else {
        local_20 = (byte *)0x0;
      }
      IVar13 = TabItemCalcSize((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                               ,SUB41((uint)in_stack_fffffffffffffe64 >> 0x18,0));
      local_68 = TabBarFindTabByID((ImGuiTabBar *)
                                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
      bVar11 = local_68 == (ImGuiTabItem *)0x0;
      local_5c = IVar13.x;
      if (bVar11) {
        ImGuiTabItem::ImGuiTabItem(in_stack_fffffffffffffe50);
        ImVector<ImGuiTabItem>::push_back
                  ((ImVector<ImGuiTabItem> *)in_stack_fffffffffffffe50,
                   (ImGuiTabItem *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        local_68 = ImVector<ImGuiTabItem>::back(&in_RDI->Tabs);
        local_68->ID = IVar7;
        local_68->Width = local_5c;
        in_RDI->TabsAddedNew = true;
      }
      iVar8 = ImVector<ImGuiTabItem>::index_from_ptr(&in_RDI->Tabs,local_68);
      in_RDI->LastTabItemIdx = (ImS16)iVar8;
      local_68->ContentWidth = local_5c;
      sVar2 = in_RDI->TabsActiveCount;
      in_RDI->TabsActiveCount = sVar2 + 1;
      local_68->BeginOrder = sVar2;
      if (local_20 == (byte *)0x0) {
        local_24 = local_24 | 0x100000;
      }
      bVar4 = in_RDI->PrevFrameVisible + 1 < pIVar6->FrameCount;
      bVar5 = local_68->LastFrameVisible + 1 < pIVar6->FrameCount;
      bVar12 = (local_24 & 0x200000) != 0;
      local_68->LastFrameVisible = pIVar6->FrameCount;
      local_68->Flags = local_24;
      iVar8 = ImGuiTextBuffer::size(&in_RDI->TabsNames);
      local_68->NameOffset = (ImS16)iVar8;
      IVar16 = (ImGuiID)((ulong)&in_RDI->TabsNames >> 0x20);
      out_hovered = in_RSI;
      bb_00 = in_RSI;
      strlen((char *)in_RSI);
      ImGuiTextBuffer::append
                ((ImGuiTextBuffer *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (char *)CONCAT17(in_stack_fffffffffffffe77,
                                  CONCAT16(in_stack_fffffffffffffe76,
                                           CONCAT24(in_stack_fffffffffffffe74,
                                                    in_stack_fffffffffffffe70))));
      if ((((bVar5) && ((in_RDI->Flags & 2U) != 0)) && (in_RDI->NextSelectedTabId == 0)) &&
         (((!bVar4 || (in_RDI->SelectedTabId == 0)) && (!bVar12)))) {
        in_RDI->NextSelectedTabId = IVar7;
      }
      if ((((local_24 & 2) != 0) && (in_RDI->SelectedTabId != IVar7)) && (!bVar12)) {
        in_RDI->NextSelectedTabId = IVar7;
      }
      local_1 = in_RDI->VisibleTabId == IVar7;
      if (local_1) {
        in_RDI->VisibleTabWasSubmitted = true;
      }
      else if ((((in_RDI->SelectedTabId == 0) && (bVar4)) && ((in_RDI->Tabs).Size == 1)) &&
              ((in_RDI->Flags & 2U) == 0)) {
        local_1 = true;
      }
      if ((!bVar5) || ((bVar4 && (!bVar11)))) {
        if (in_RDI->SelectedTabId == IVar7) {
          local_68->LastFrameSelected = pIVar6->FrameCount;
        }
        IVar13 = (pIVar3->DC).CursorPos;
        bVar11 = (local_68->Flags & 0xc0U) == 0;
        uVar17 = CONCAT13(bVar11,(int3)in_stack_ffffffffffffff4c);
        if (bVar11) {
          flags_01 = (ImGuiButtonFlags)((ulong)&in_RDI->BarRect >> 0x20);
          in_stack_fffffffffffffe90 = &local_c4;
          ImVec2::ImVec2(in_stack_fffffffffffffe90,
                         (float)(int)(local_68->Offset - in_RDI->ScrollingAnim),0.0);
          IVar14 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                             ,(ImVec2 *)0x1b2422);
          local_bc = IVar14.x;
          in_stack_ffffffffffffff48 = IVar14.y;
          (pIVar3->DC).CursorPos = IVar14;
        }
        else {
          in_stack_fffffffffffffe78 = &in_RDI->BarRect;
          in_stack_fffffffffffffe80 = (ImVec2 *)&stack0xffffffffffffff2c;
          ImVec2::ImVec2(in_stack_fffffffffffffe80,local_68->Offset,0.0);
          IVar14 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)
                             ,(ImVec2 *)0x1b2486);
          in_stack_ffffffffffffff34 = IVar14.x;
          (pIVar3->DC).CursorPos = IVar14;
        }
        IVar14 = (pIVar3->DC).CursorPos;
        IVar15 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (ImVec2 *)0x1b24d2);
        ImRect::ImRect((ImRect *)&stack0xffffffffffffff10,(ImVec2 *)&stack0xffffffffffffff20,
                       (ImVec2 *)&stack0xffffffffffffff08);
        intersect_with_current_clip_rect = false;
        if (((uVar17 & 0x1000000) != 0) &&
           (in_stack_fffffffffffffe76 = true,
           intersect_with_current_clip_rect = in_stack_fffffffffffffe76,
           in_RDI->ScrollingRectMinX <= in_stack_ffffffffffffff10)) {
          in_stack_fffffffffffffe76 =
               in_RDI->ScrollingRectMaxX <= local_e8 && local_e8 != in_RDI->ScrollingRectMaxX;
          intersect_with_current_clip_rect = in_stack_fffffffffffffe76;
        }
        is_contents_visible = intersect_with_current_clip_rect;
        if ((bool)intersect_with_current_clip_rect != false) {
          _x = ImMax<float>(in_stack_ffffffffffffff10,in_RDI->ScrollingRectMinX);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffefc,_x,in_stack_ffffffffffffff14 - 1.0);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef4,in_RDI->ScrollingRectMaxX,
                         in_stack_ffffffffffffff1c);
          PushClipRect(in_stack_fffffffffffffe80,&in_stack_fffffffffffffe78->Min,
                       (bool)intersect_with_current_clip_rect);
        }
        local_118 = (pIVar3->DC).CursorMaxPos;
        local_120 = ImRect::GetSize((ImRect *)
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        ItemSize((ImVec2 *)
                 CONCAT17(intersect_with_current_clip_rect,
                          CONCAT16(in_stack_fffffffffffffe76,
                                   CONCAT24(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))),
                 in_stack_fffffffffffffe6c);
        (pIVar3->DC).CursorMaxPos = local_118;
        bVar11 = ItemAdd(in_stack_fffffffffffffe78,
                         CONCAT13(intersect_with_current_clip_rect,
                                  CONCAT12(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74)),
                         (ImRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if (bVar11) {
          uVar9 = 0x10;
          if (bVar12) {
            uVar9 = 0x20;
          }
          local_124 = uVar9 | 0x1000;
          if ((pIVar6->DragDropActive & 1U) != 0) {
            local_124 = uVar9 | 0x1200;
          }
          local_127 = ButtonBehavior(bb_00,IVar16,(bool *)out_hovered,
                                     (bool *)in_stack_fffffffffffffe90,flags_01);
          if (((bool)local_127) && (!bVar12)) {
            in_RDI->NextSelectedTabId = IVar7;
          }
          local_125 = (local_125 & 1) != 0 || pIVar6->HoveredId == IVar7;
          if (pIVar6->ActiveId != IVar7) {
            SetItemAllowOverlap();
          }
          if (((((local_126 & 1) != 0) && (!bVar5)) &&
              (bVar11 = IsMouseDragging((ImGuiMouseButton)in_stack_fffffffffffffe50,
                                        in_stack_fffffffffffffe4c), bVar11)) &&
             (((pIVar6->DragDropActive & 1U) == 0 && ((in_RDI->Flags & 1U) != 0)))) {
            pIVar1 = &(pIVar6->IO).MouseDelta;
            if ((0.0 < pIVar1->x || pIVar1->x == 0.0) ||
               (in_stack_ffffffffffffff10 <= (pIVar6->IO).MousePos.x)) {
              if (((0.0 < (pIVar6->IO).MouseDelta.x) && (local_e8 < (pIVar6->IO).MousePos.x)) &&
                 ((in_RDI->Flags & 1U) != 0)) {
                TabBarQueueReorder(in_RDI,local_68,1);
              }
            }
            else if ((in_RDI->Flags & 1U) != 0) {
              TabBarQueueReorder(in_RDI,local_68,-1);
            }
          }
          local_130 = pIVar3->DrawList;
          local_134 = GetColorU32(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
          TabItemBackground((ImDrawList *)CONCAT17(is_contents_visible,in_stack_ffffffffffffff00),
                            (ImRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                            (ImGuiTabItemFlags)in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
          RenderNavHighlight((ImRect *)CONCAT17(is_contents_visible,in_stack_ffffffffffffff00),
                             (ImGuiID)in_stack_fffffffffffffefc,
                             (ImGuiNavHighlightFlags)in_stack_fffffffffffffef8);
          local_135 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe50);
          IVar16 = (ImGuiID)((ulong)in_stack_fffffffffffffe50 >> 0x20);
          if (((bool)local_135) &&
             (((bVar11 = IsMouseClicked((ImGuiMouseButton)in_stack_fffffffffffffe60,
                                        SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0)), bVar11
               || (bVar11 = IsMouseReleased(1), bVar11)) && (!bVar12)))) {
            in_RDI->NextSelectedTabId = IVar7;
          }
          if (local_20 == (byte *)0x0) {
            local_13c = 0;
          }
          else {
            local_13c = GetIDWithSeed((char *)CONCAT44(in_stack_fffffffffffffe64,
                                                       in_stack_fffffffffffffe60),
                                      (char *)in_stack_fffffffffffffe58,IVar16);
          }
          flags_00 = (ImGuiHoveredFlags)&local_13d;
          frame_padding.y = in_stack_ffffffffffffff34;
          frame_padding.x = in_stack_ffffffffffffff30;
          TabItemLabelAndCloseButton
                    (in_stack_ffffffffffffff28,(ImRect *)IVar14,
                     (ImGuiTabItemFlags)in_stack_ffffffffffffff1c,frame_padding,
                     (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (ImGuiID)IVar15.y,(ImGuiID)IVar15.x,(bool)is_contents_visible,
                     (bool *)CONCAT44(uVar17,in_stack_ffffffffffffff48),(bool *)IVar13);
          if (((local_13d & 1) != 0) && (local_20 != (byte *)0x0)) {
            *local_20 = 0;
            TabBarCloseTab(in_RDI,local_68);
          }
          if ((is_contents_visible & 1) != 0) {
            PopClipRect();
          }
          (pIVar3->DC).CursorPos = IVar13;
          if ((((local_13e & 1) != 0) && (pIVar6->HoveredId == IVar7)) &&
             ((((local_126 & 1) == 0 &&
               (((pIVar6->TooltipSlowDelay <= pIVar6->HoveredIdNotActiveTimer &&
                  pIVar6->HoveredIdNotActiveTimer != pIVar6->TooltipSlowDelay &&
                 (bVar11 = IsItemHovered(flags_00), bVar11)) && ((in_RDI->Flags & 0x20U) == 0)))) &&
              ((local_68->Flags & 0x10U) == 0)))) {
            pcVar10 = FindRenderedTextEnd((char *)in_RSI,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar10 - (int)in_RSI),in_RSI);
          }
          if (bVar12) {
            local_1 = (bool)(local_127 & 1);
          }
        }
        else {
          if ((is_contents_visible & 1) != 0) {
            PopClipRect();
          }
          (pIVar3->DC).CursorPos = IVar13;
        }
      }
      else {
        PushItemFlag(in_stack_fffffffffffffe64,SUB41((uint)in_stack_fffffffffffffe60 >> 0x18,0));
        ImRect::ImRect((ImRect *)in_stack_fffffffffffffe50);
        ItemAdd(in_stack_fffffffffffffe78,
                CONCAT13(in_stack_fffffffffffffe77,
                         CONCAT12(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74)),
                (ImRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        PopItemFlag();
        if (bVar12) {
          local_1 = false;
        }
      }
    }
    else {
      PushItemFlag(in_stack_fffffffffffffe64,SUB41((uint)in_stack_fffffffffffffe60 >> 0x18,0));
      ImRect::ImRect((ImRect *)in_stack_fffffffffffffe50);
      ItemAdd(in_stack_fffffffffffffe78,
              CONCAT13(in_stack_fffffffffffffe77,
                       CONCAT12(in_stack_fffffffffffffe76,in_stack_fffffffffffffe74)),
              (ImRect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      PopItemFlag();
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}